

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::file_line_to_stream
          (ConsoleReporter *this,char *file,int line,char *tail)

{
  ostream *poVar1;
  char *pcVar2;
  char *in_RCX;
  int in_EDX;
  long in_RDI;
  Enum in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  char *local_40;
  
  poVar1 = Color::operator<<((ostream *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffac);
  pcVar2 = skipPathFromFilename(in_stack_ffffffffffffffb8);
  poVar1 = std::operator<<(poVar1,pcVar2);
  if ((*(byte *)(*(long *)(in_RDI + 0x60) + 0x7b) & 1) == 0) {
    local_40 = "(";
  }
  else {
    local_40 = ":";
  }
  poVar1 = std::operator<<(poVar1,local_40);
  if ((*(byte *)(*(long *)(in_RDI + 0x60) + 0x7d) & 1) != 0) {
    in_EDX = 0;
  }
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDX);
  pcVar2 = "):";
  if ((*(byte *)(*(long *)(in_RDI + 0x60) + 0x7b) & 1) != 0) {
    pcVar2 = ":";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,in_RCX);
  return;
}

Assistant:

virtual void file_line_to_stream(const char* file, int line,
                                        const char* tail = "") {
            s << Color::LightGrey << skipPathFromFilename(file) << (opt.gnu_file_line ? ":" : "(")
            << (opt.no_line_numbers ? 0 : line) // 0 or the real num depending on the option
            << (opt.gnu_file_line ? ":" : "):") << tail;
        }